

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# katajainen.c
# Opt level: O3

int ZopfliLengthLimitedCodeLengths(size_t *frequencies,int n,int maxbits,uint *bitlengths)

{
  ulong *puVar1;
  int iVar2;
  Node *newchain;
  Node *leaves;
  Node *pNVar3;
  Node *(*lists) [2];
  NodePool NVar4;
  ulong uVar5;
  long lVar6;
  Node *pNVar7;
  Node *node0;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  NodePool pool;
  int counts [16];
  NodePool local_80;
  int local_78 [14];
  ulong uStack_40;
  
  leaves = (Node *)malloc((long)n * 0x18);
  if (n < 1) {
    uVar13 = 0;
  }
  else {
    uVar8 = 0;
    memset(bitlengths,0,(ulong)(uint)n * 4);
    uVar13 = 0;
    do {
      if (frequencies[uVar8] != 0) {
        leaves[(int)uVar13].weight = frequencies[uVar8];
        leaves[(int)uVar13].count = (int)uVar8;
        uVar13 = uVar13 + 1;
      }
      uVar8 = uVar8 + 1;
    } while ((uint)n != uVar8);
  }
  iVar11 = 1;
  if (1 << ((byte)maxbits & 0x1f) < (int)uVar13) {
    free(leaves);
  }
  else {
    if (uVar13 != 0) {
      if (uVar13 == 1) {
        bitlengths[leaves->count] = 1;
      }
      else if (uVar13 == 2) {
        bitlengths[leaves->count] = bitlengths[leaves->count] + 1;
        bitlengths[leaves[1].count] = bitlengths[leaves[1].count] + 1;
      }
      else {
        if ((int)uVar13 < 1) {
          qsort(leaves,(long)(int)uVar13,0x18,LeafComparator);
        }
        else {
          uVar8 = (ulong)uVar13;
          lVar6 = 0;
          do {
            uVar5 = *(ulong *)((long)&leaves->weight + lVar6);
            if (uVar5 >> 0x37 != 0) {
              free(leaves);
              return 1;
            }
            *(ulong *)((long)&leaves->weight + lVar6) =
                 (long)*(int *)((long)&leaves->count + lVar6) | uVar5 << 9;
            lVar6 = lVar6 + 0x18;
          } while (uVar8 * 0x18 != lVar6);
          qsort(leaves,uVar8,0x18,LeafComparator);
          if (0 < (int)uVar13) {
            lVar6 = 0;
            do {
              puVar1 = (ulong *)((long)&leaves->weight + lVar6);
              *puVar1 = *puVar1 >> 9;
              lVar6 = lVar6 + 0x18;
            } while (uVar8 * 0x18 != lVar6);
          }
        }
        uVar12 = uVar13 - 1;
        if (maxbits < (int)uVar13) {
          uVar12 = maxbits;
        }
        pNVar3 = (Node *)malloc((long)(int)(uVar13 * 2 * uVar12) * 0x18);
        lists = (Node *(*) [2])malloc((long)(int)uVar12 << 4);
        local_80.next = pNVar3 + 2;
        pNVar3->weight = leaves->weight;
        pNVar3->count = 1;
        pNVar3->tail = (Node *)0x0;
        pNVar3[1].weight = leaves[1].weight;
        pNVar3[1].count = 2;
        pNVar3[1].tail = (Node *)0x0;
        if (0 < (int)uVar12) {
          lVar6 = 0;
          do {
            *(Node **)((long)*lists + lVar6) = pNVar3;
            *(Node **)((long)*lists + lVar6 + 8) = pNVar3 + 1;
            lVar6 = lVar6 + 0x10;
          } while ((ulong)uVar12 << 4 != lVar6);
        }
        if (2 < (int)uVar13) {
          iVar2 = uVar13 * 2 + -5;
          iVar11 = 1;
          if (1 < iVar2) {
            iVar11 = iVar2;
          }
          do {
            BoundaryPM(lists,leaves,uVar13,&local_80,uVar12 - 1);
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        lVar6 = (long)(int)(uVar12 - 1);
        pNVar7 = lists[lVar6 + -1][1];
        NVar4.next = lists[lVar6][1];
        iVar11 = (NVar4.next)->count;
        if ((iVar11 < (int)uVar13) &&
           (leaves[iVar11].weight < pNVar7->weight + lists[lVar6 + -1][0]->weight)) {
          pNVar7 = (NVar4.next)->tail;
          lists[lVar6][1] = local_80.next;
          (local_80.next)->count = iVar11 + 1;
          NVar4.next = local_80.next;
        }
        (NVar4.next)->tail = pNVar7;
        local_78[0xc] = 0;
        local_78[0xd] = 0;
        uStack_40 = 0;
        local_78[8] = 0;
        local_78[9] = 0;
        local_78[10] = 0;
        local_78[0xb] = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        local_78[6] = 0;
        local_78[7] = 0;
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        uVar8 = 0x10;
        do {
          uVar13 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar13;
          local_78[uVar8] = (NVar4.next)->count;
          NVar4.next = (NVar4.next)->tail;
        } while (NVar4.next != (Node *)0x0);
        if (uVar13 < 0x10) {
          uVar5 = uStack_40 >> 0x20;
          uVar13 = 1;
          uVar9 = 0xf;
          do {
            iVar11 = *(int *)((long)&local_80.next + uVar9 * 4 + 4);
            if (iVar11 < (int)uVar5) {
              uVar5 = (ulong)(int)uVar5;
              piVar10 = &leaves[uVar5 - 1].count;
              do {
                bitlengths[*piVar10] = uVar13;
                uVar5 = uVar5 - 1;
                piVar10 = piVar10 + -6;
              } while ((long)iVar11 < (long)uVar5);
            }
            uVar9 = uVar9 - 1;
            uVar13 = uVar13 + 1;
          } while (uVar8 <= uVar9);
        }
        free(lists);
        free(leaves);
        leaves = pNVar3;
      }
    }
    free(leaves);
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int ZopfliLengthLimitedCodeLengths(
    const size_t* frequencies, int n, int maxbits, unsigned* bitlengths) {
  NodePool pool;
  int i;
  int numsymbols = 0;  /* Amount of symbols with frequency > 0. */
  int numBoundaryPMRuns;
  Node* nodes;

  /* Array of lists of chains. Each list requires only two lookahead chains at
  a time, so each list is a array of two Node*'s. */
  Node* (*lists)[2];

  /* One leaf per symbol. Only numsymbols leaves will be used. */
  Node* leaves = (Node*)malloc(n * sizeof(*leaves));

  /* Initialize all bitlengths at 0. */
  for (i = 0; i < n; i++) {
    bitlengths[i] = 0;
  }

  /* Count used symbols and place them in the leaves. */
  for (i = 0; i < n; i++) {
    if (frequencies[i]) {
      leaves[numsymbols].weight = frequencies[i];
      leaves[numsymbols].count = i;  /* Index of symbol this leaf represents. */
      numsymbols++;
    }
  }

  /* Check special cases and error conditions. */
  if ((1 << maxbits) < numsymbols) {
    free(leaves);
    return 1;  /* Error, too few maxbits to represent symbols. */
  }
  if (numsymbols == 0) {
    free(leaves);
    return 0;  /* No symbols at all. OK. */
  }
  if (numsymbols == 1) {
    bitlengths[leaves[0].count] = 1;
    free(leaves);
    return 0;  /* Only one symbol, give it bitlength 1, not 0. OK. */
  }
  if (numsymbols == 2) {
    bitlengths[leaves[0].count]++;
    bitlengths[leaves[1].count]++;
    free(leaves);
    return 0;
  }

  /* Sort the leaves from lightest to heaviest. Add count into the same
  variable for stable sorting. */
  for (i = 0; i < numsymbols; i++) {
    if (leaves[i].weight >=
        ((size_t)1 << (sizeof(leaves[0].weight) * CHAR_BIT - 9))) {
      free(leaves);
      return 1;  /* Error, we need 9 bits for the count. */
    }
    leaves[i].weight = (leaves[i].weight << 9) | leaves[i].count;
  }
  qsort(leaves, numsymbols, sizeof(Node), LeafComparator);
  for (i = 0; i < numsymbols; i++) {
    leaves[i].weight >>= 9;
  }

  if (numsymbols - 1 < maxbits) {
    maxbits = numsymbols - 1;
  }

  /* Initialize node memory pool. */
  nodes = (Node*)malloc(maxbits * 2 * numsymbols * sizeof(Node));
  pool.next = nodes;

  lists = (Node* (*)[2])malloc(maxbits * sizeof(*lists));
  InitLists(&pool, leaves, maxbits, lists);

  /* In the last list, 2 * numsymbols - 2 active chains need to be created. Two
  are already created in the initialization. Each BoundaryPM run creates one. */
  numBoundaryPMRuns = 2 * numsymbols - 4;
  for (i = 0; i < numBoundaryPMRuns - 1; i++) {
    BoundaryPM(lists, leaves, numsymbols, &pool, maxbits - 1);
  }
  BoundaryPMFinal(lists, leaves, numsymbols, &pool, maxbits - 1);

  ExtractBitLengths(lists[maxbits - 1][1], leaves, bitlengths);

  free(lists);
  free(leaves);
  free(nodes);
  return 0;  /* OK. */
}